

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int codeEqualityTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  u8 uVar1;
  uint uVar2;
  Vdbe *pVVar3;
  WhereLoop *pWVar4;
  Index *pIVar5;
  InLoop *__src;
  size_t __n;
  sqlite3 *psVar6;
  int p1;
  Parse *pParse_00;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  InLoop *pIVar10;
  long lVar11;
  Expr *pEVar12;
  ExprList *pEVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ExprList_item *pEVar18;
  Expr *p;
  long lVar19;
  int iTab;
  ExprList_item *local_a8;
  int local_a0;
  int local_9c;
  Parse *local_98;
  Expr *local_90;
  WhereLevel *local_88;
  int local_7c;
  Expr *local_78;
  sqlite3 *local_70;
  ExprList *local_68;
  Vdbe *local_60;
  ExprList_item *local_58;
  ExprList_item *local_50;
  WhereTerm *local_48;
  ExprList *local_40;
  ExprList *local_38;
  
  p = pTerm->pExpr;
  uVar1 = p->op;
  if (uVar1 == '5') {
LAB_001ae206:
    iTarget = sqlite3ExprCodeTarget(pParse,p->pRight,iTarget);
    goto LAB_001ae5b8;
  }
  pVVar3 = pParse->pVdbe;
  if (uVar1 == '2') {
    sqlite3VdbeAddOp2(pVVar3,0x4b,0,iTarget);
    goto LAB_001ae5b8;
  }
  if (uVar1 == '-') goto LAB_001ae206;
  pWVar4 = pLevel->pWLoop;
  if ((((pWVar4->wsFlags & 0x400) == 0) &&
      (pIVar5 = (pWVar4->u).btree.pIndex, pIVar5 != (Index *)0x0)) &&
     (pIVar5->aSortOrder[iEq] != '\0')) {
    bRev = (int)(bRev == 0);
  }
  lVar19 = (long)iEq;
  uVar9 = 0;
  uVar15 = 0;
  if (0 < iEq) {
    uVar15 = (ulong)(uint)iEq;
  }
  for (; local_a0 = iEq, local_98 = pParse, local_60 = pVVar3, uVar15 != uVar9; uVar9 = uVar9 + 1) {
    if ((pWVar4->aLTerm[uVar9] != (WhereTerm *)0x0) && (pWVar4->aLTerm[uVar9]->pExpr == p))
    goto LAB_001ae5c8;
  }
  uVar17 = 0;
  for (lVar16 = lVar19; lVar16 < (long)(ulong)pWVar4->nLTerm; lVar16 = lVar16 + 1) {
    uVar17 = uVar17 + (pWVar4->aLTerm[lVar16]->pExpr == p);
  }
  iTab = 0;
  local_88 = pLevel;
  local_7c = iTarget;
  local_48 = pTerm;
  if (((p->flags >> 0xc & 1) == 0) || (((p->x).pSelect)->pEList->nExpr == 1)) {
    local_a8 = (ExprList_item *)0x0;
LAB_001ae312:
    local_9c = sqlite3FindInIndex(pParse,p,4,(int *)0x0,(int *)local_a8,&iTab);
  }
  else {
    if (((p->flags >> 0x19 & 1) != 0) && (p->iTable != 0)) {
      uVar8 = sqlite3ExprVectorSize(p->pLeft);
      pParse = local_98;
      if ((int)uVar8 < (int)uVar17) {
        uVar8 = uVar17;
      }
      local_a8 = (ExprList_item *)sqlite3DbMallocZero(local_98->db,(ulong)uVar8 * 4);
      goto LAB_001ae312;
    }
    psVar6 = pParse->db;
    local_a8 = (ExprList_item *)0x0;
    pEVar12 = sqlite3ExprDup(psVar6,p,0);
    local_9c = 5;
    local_70 = psVar6;
    if (psVar6->mallocFailed == '\0') {
      local_40 = ((pEVar12->x).pSelect)->pEList;
      local_38 = (pEVar12->pLeft->x).pList;
      pEVar18 = local_40->a;
      local_a8 = local_38->a;
      pEVar13 = (ExprList *)0x0;
      local_90 = (Expr *)0x0;
      local_78 = pEVar12;
      local_58 = pEVar18;
      for (lVar16 = lVar19; psVar6 = local_70, lVar16 < (long)(ulong)pWVar4->nLTerm;
          lVar16 = lVar16 + 1) {
        if (pWVar4->aLTerm[lVar16]->pExpr == p) {
          lVar11 = (long)(pWVar4->aLTerm[lVar16]->u).x.iField + -1;
          if (pEVar18[lVar11].pExpr != (Expr *)0x0) {
            local_50 = pEVar18 + lVar11;
            local_68 = pEVar13;
            local_90 = (Expr *)sqlite3ExprListAppend
                                         (local_98,(ExprList *)local_90,pEVar18[lVar11].pExpr);
            local_50->pExpr = (Expr *)0x0;
            pEVar13 = sqlite3ExprListAppend(local_98,local_68,local_a8[lVar11].pExpr);
            local_a8[lVar11].pExpr = (Expr *)0x0;
            pEVar18 = local_58;
          }
        }
      }
      sqlite3ExprListDelete(local_70,local_40);
      sqlite3ExprListDelete(psVar6,local_38);
      (local_78->pLeft->x).pList = pEVar13;
      ((local_78->x).pSelect)->pEList = (ExprList *)local_90;
      if ((pEVar13 != (ExprList *)0x0) && (pEVar13->nExpr == 1)) {
        pEVar12 = pEVar13->a[0].pExpr;
        pEVar13->a[0].pExpr = (Expr *)0x0;
        sqlite3ExprDelete(local_70,local_78->pLeft);
        local_78->pLeft = pEVar12;
      }
      pTerm = local_48;
      pParse_00 = local_98;
      pEVar13 = ((local_78->x).pSelect)->pOrderBy;
      if (pEVar13 != (ExprList *)0x0) {
        uVar15 = 0;
        uVar9 = (ulong)(uint)pEVar13->nExpr;
        if (pEVar13->nExpr < 1) {
          uVar9 = uVar15;
        }
        for (; uVar9 * 0x18 - uVar15 != 0; uVar15 = uVar15 + 0x18) {
          *(undefined2 *)((long)&pEVar13->a[0].u + uVar15) = 0;
        }
      }
      if (local_70->mallocFailed == '\0') {
        local_a8 = (ExprList_item *)sqlite3DbMallocZero(local_98->db,(ulong)uVar17 << 2);
        pEVar12 = local_78;
        local_9c = sqlite3FindInIndex(pParse_00,local_78,4,(int *)0x0,(int *)local_a8,&iTab);
        p->iTable = iTab;
      }
      else {
        local_a8 = (ExprList_item *)0x0;
        pEVar12 = local_78;
      }
    }
    sqlite3ExprDelete(local_70,pEVar12);
  }
  p1 = iTab;
  uVar8 = (uint)(bRev == 0);
  if (local_9c != 4) {
    uVar8 = bRev;
  }
  sqlite3VdbeAddOp2(local_60,(uint)(uVar8 == 0) * 4 + 0x20,iTab,0);
  uVar2 = pWVar4->wsFlags;
  pWVar4->wsFlags = uVar2 | 0x800;
  if ((local_88->u).in.nIn == 0) {
    iVar14 = local_98->nLabel + -1;
    local_98->nLabel = iVar14;
    local_88->addrNxt = iVar14;
  }
  if ((0 < local_a0) && ((uVar2 & 0x100000) == 0)) {
    pWVar4->wsFlags = uVar2 | 0x40800;
  }
  local_90 = (Expr *)(long)(local_88->u).in.nIn;
  (local_88->u).in.nIn = (int)(&local_90->op + (int)uVar17);
  __src = (local_88->u).in.aInLoop;
  pIVar10 = (InLoop *)
            sqlite3WhereMalloc(pTerm->pWC->pWInfo,(long)(&local_90->op + (int)uVar17) * 0x14);
  if ((__src == (InLoop *)0x0) || (pIVar10 == (InLoop *)0x0)) {
    (local_88->u).in.aInLoop = pIVar10;
    if (pIVar10 != (InLoop *)0x0) goto LAB_001ae400;
    (local_88->u).in.nIn = 0;
    pLevel = local_88;
    iTarget = local_7c;
  }
  else {
    __n._0_4_ = __src[-1].nPrefix;
    __n._4_1_ = __src[-1].eEndLoopOp;
    __n._5_3_ = *(undefined3 *)&__src[-1].field_0x11;
    memcpy(pIVar10,__src,__n);
    (local_88->u).in.aInLoop = pIVar10;
LAB_001ae400:
    pIVar10 = pIVar10 + (long)local_90;
    local_50 = (ExprList_item *)(CONCAT71(local_50._1_7_,uVar8 == 0) | 0x26);
    local_58 = (ExprList_item *)CONCAT44(local_58._4_4_,local_7c - local_a0);
    lVar16 = 0;
    local_68 = (ExprList *)((ulong)local_68 & 0xffffffff00000000);
    iVar14 = local_7c;
    local_90 = p;
    for (; pVVar3 = local_60, iTarget = local_7c, pLevel = local_88,
        lVar19 < (long)(ulong)pWVar4->nLTerm; lVar19 = lVar19 + 1) {
      if (pWVar4->aLTerm[lVar19]->pExpr == p) {
        if (local_9c == 1) {
          iVar7 = sqlite3VdbeAddOp2(local_60,0x87,p1,iVar14);
        }
        else {
          if (local_a8 == (ExprList_item *)0x0) {
            iVar7 = 0;
          }
          else {
            lVar11 = (long)(int)local_68;
            local_68 = (ExprList *)CONCAT44(local_68._4_4_,(int)local_68 + 1);
            iVar7 = *(int *)((long)local_a8 + lVar11 * 4);
          }
          iVar7 = sqlite3VdbeAddOp3(local_60,0x5e,p1,iVar7,iVar14);
        }
        pIVar10->addrInTop = iVar7;
        sqlite3VdbeAddOp1(pVVar3,0x32,iVar14);
        if (lVar16 == 0) {
          pIVar10->iCur = p1;
          pIVar10->eEndLoopOp = (u8)local_50;
          if (local_a0 < 1) {
            pIVar10->nPrefix = 0;
          }
          else {
            pIVar10->iBase = (int)local_58;
            pIVar10->nPrefix = local_a0;
          }
        }
        else {
          pIVar10->eEndLoopOp = 0xb8;
        }
        pIVar10 = pIVar10 + 1;
        p = local_90;
      }
      lVar16 = lVar16 + -1;
      iVar14 = iVar14 + 1;
    }
    if ((0 < local_a0) && ((pWVar4->wsFlags & 0x100400) == 0)) {
      sqlite3VdbeAddOp3(local_60,0x7d,local_88->iIdxCur,0,local_a0);
    }
  }
  sqlite3DbFree(local_98->db,local_a8);
  pTerm = local_48;
LAB_001ae5b8:
  if (((pLevel->pWLoop->wsFlags & 0x200000) == 0) || ((pTerm->eOperator & 0x800) == 0)) {
LAB_001ae5c8:
    disableTerm(pLevel,pTerm);
  }
  return iTarget;
}

Assistant:

static int codeEqualityTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  Vdbe *v = pParse->pVdbe;
  int iReg;                  /* Register holding results */

  assert( pLevel->pWLoop->aLTerm[iEq]==pTerm );
  assert( iTarget>0 );
  if( pX->op==TK_EQ || pX->op==TK_IS ){
    iReg = sqlite3ExprCodeTarget(pParse, pX->pRight, iTarget);
  }else if( pX->op==TK_ISNULL ){
    iReg = iTarget;
    sqlite3VdbeAddOp2(v, OP_Null, 0, iReg);
#ifndef SQLITE_OMIT_SUBQUERY
  }else{
    int eType = IN_INDEX_NOOP;
    int iTab;
    struct InLoop *pIn;
    WhereLoop *pLoop = pLevel->pWLoop;
    int i;
    int nEq = 0;
    int *aiMap = 0;

    if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
      && pLoop->u.btree.pIndex!=0
      && pLoop->u.btree.pIndex->aSortOrder[iEq]
    ){
      testcase( iEq==0 );
      testcase( bRev );
      bRev = !bRev;
    }
    assert( pX->op==TK_IN );
    iReg = iTarget;

    for(i=0; i<iEq; i++){
      if( pLoop->aLTerm[i] && pLoop->aLTerm[i]->pExpr==pX ){
        disableTerm(pLevel, pTerm);
        return iTarget;
      }
    }
    for(i=iEq;i<pLoop->nLTerm; i++){
      assert( pLoop->aLTerm[i]!=0 );
      if( pLoop->aLTerm[i]->pExpr==pX ) nEq++;
    }

    iTab = 0;
    if( !ExprUseXSelect(pX) || pX->x.pSelect->pEList->nExpr==1 ){
      eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, 0, &iTab);
    }else{
      Expr *pExpr = pTerm->pExpr;
      if( pExpr->iTable==0 || !ExprHasProperty(pExpr, EP_Subrtn) ){
        sqlite3 *db = pParse->db;
        pX = removeUnindexableInClauseTerms(pParse, iEq, pLoop, pX);
        if( !db->mallocFailed ){
          aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*nEq);
          eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap,&iTab);
          pExpr->iTable = iTab;
        }
        sqlite3ExprDelete(db, pX);
      }else{
        int n = sqlite3ExprVectorSize(pX->pLeft);
        aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*MAX(nEq,n));
        eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap, &iTab);
      }
      pX = pExpr;
    }

    if( eType==IN_INDEX_INDEX_DESC ){
      testcase( bRev );
      bRev = !bRev;
    }
    sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
    VdbeCoverageIf(v, bRev);
    VdbeCoverageIf(v, !bRev);

    assert( (pLoop->wsFlags & WHERE_MULTI_OR)==0 );
    pLoop->wsFlags |= WHERE_IN_ABLE;
    if( pLevel->u.in.nIn==0 ){
      pLevel->addrNxt = sqlite3VdbeMakeLabel(pParse);
    }
    if( iEq>0 && (pLoop->wsFlags & WHERE_IN_SEEKSCAN)==0 ){
      pLoop->wsFlags |= WHERE_IN_EARLYOUT;
    }

    i = pLevel->u.in.nIn;
    pLevel->u.in.nIn += nEq;
    pLevel->u.in.aInLoop =
       sqlite3WhereRealloc(pTerm->pWC->pWInfo,
                           pLevel->u.in.aInLoop,
                           sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
    pIn = pLevel->u.in.aInLoop;
    if( pIn ){
      int iMap = 0;               /* Index in aiMap[] */
      pIn += i;
      for(i=iEq;i<pLoop->nLTerm; i++){
        if( pLoop->aLTerm[i]->pExpr==pX ){
          int iOut = iReg + i - iEq;
          if( eType==IN_INDEX_ROWID ){
            pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iOut);
          }else{
            int iCol = aiMap ? aiMap[iMap++] : 0;
            pIn->addrInTop = sqlite3VdbeAddOp3(v,OP_Column,iTab, iCol, iOut);
          }
          sqlite3VdbeAddOp1(v, OP_IsNull, iOut); VdbeCoverage(v);
          if( i==iEq ){
            pIn->iCur = iTab;
            pIn->eEndLoopOp = bRev ? OP_Prev : OP_Next;
            if( iEq>0 ){
              pIn->iBase = iReg - i;
              pIn->nPrefix = i;
            }else{
              pIn->nPrefix = 0;
            }
          }else{
            pIn->eEndLoopOp = OP_Noop;
          }
          pIn++;
        }
      }
      testcase( iEq>0
                && (pLoop->wsFlags & WHERE_IN_SEEKSCAN)==0
                && (pLoop->wsFlags & WHERE_VIRTUALTABLE)!=0 );
      if( iEq>0
       && (pLoop->wsFlags & (WHERE_IN_SEEKSCAN|WHERE_VIRTUALTABLE))==0
      ){
        sqlite3VdbeAddOp3(v, OP_SeekHit, pLevel->iIdxCur, 0, iEq);
      }
    }else{
      pLevel->u.in.nIn = 0;
    }
    sqlite3DbFree(pParse->db, aiMap);
#endif
  }

  /* As an optimization, try to disable the WHERE clause term that is
  ** driving the index as it will always be true.  The correct answer is
  ** obtained regardless, but we might get the answer with fewer CPU cycles
  ** by omitting the term.
  **
  ** But do not disable the term unless we are certain that the term is
  ** not a transitive constraint.  For an example of where that does not
  ** work, see https://sqlite.org/forum/forumpost/eb8613976a (2021-05-04)
  */
  if( (pLevel->pWLoop->wsFlags & WHERE_TRANSCONS)==0
   || (pTerm->eOperator & WO_EQUIV)==0
  ){
    disableTerm(pLevel, pTerm);
  }

  return iReg;
}